

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void prepare_coeffs_12taps(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int16_t *piVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  
  piVar4 = filter_params->filter_ptr;
  uVar7 = (ulong)((uint)filter_params->taps * (subpel_q4 & 0xfU));
  uVar6 = *(undefined4 *)(piVar4 + uVar7);
  uVar1 = *(undefined4 *)(piVar4 + uVar7 + 2);
  uVar2 = *(undefined4 *)(piVar4 + uVar7 + 4);
  uVar3 = *(undefined4 *)(piVar4 + uVar7 + 6);
  *(undefined4 *)*coeffs = uVar6;
  *(undefined4 *)((long)*coeffs + 4) = uVar6;
  *(undefined4 *)(*coeffs + 1) = uVar6;
  *(undefined4 *)((long)*coeffs + 0xc) = uVar6;
  *(undefined4 *)(*coeffs + 2) = uVar6;
  *(undefined4 *)((long)*coeffs + 0x14) = uVar6;
  *(undefined4 *)(*coeffs + 3) = uVar6;
  *(undefined4 *)((long)*coeffs + 0x1c) = uVar6;
  *(undefined4 *)coeffs[1] = uVar1;
  *(undefined4 *)((long)coeffs[1] + 4) = uVar1;
  *(undefined4 *)(coeffs[1] + 1) = uVar1;
  *(undefined4 *)((long)coeffs[1] + 0xc) = uVar1;
  *(undefined4 *)(coeffs[1] + 2) = uVar1;
  *(undefined4 *)((long)coeffs[1] + 0x14) = uVar1;
  *(undefined4 *)(coeffs[1] + 3) = uVar1;
  *(undefined4 *)((long)coeffs[1] + 0x1c) = uVar1;
  *(undefined4 *)coeffs[2] = uVar2;
  *(undefined4 *)((long)coeffs[2] + 4) = uVar2;
  *(undefined4 *)(coeffs[2] + 1) = uVar2;
  *(undefined4 *)((long)coeffs[2] + 0xc) = uVar2;
  *(undefined4 *)(coeffs[2] + 2) = uVar2;
  *(undefined4 *)((long)coeffs[2] + 0x14) = uVar2;
  *(undefined4 *)(coeffs[2] + 3) = uVar2;
  *(undefined4 *)((long)coeffs[2] + 0x1c) = uVar2;
  *(undefined4 *)coeffs[3] = uVar3;
  *(undefined4 *)((long)coeffs[3] + 4) = uVar3;
  *(undefined4 *)(coeffs[3] + 1) = uVar3;
  *(undefined4 *)((long)coeffs[3] + 0xc) = uVar3;
  *(undefined4 *)(coeffs[3] + 2) = uVar3;
  *(undefined4 *)((long)coeffs[3] + 0x14) = uVar3;
  *(undefined4 *)(coeffs[3] + 3) = uVar3;
  *(undefined4 *)((long)coeffs[3] + 0x1c) = uVar3;
  uVar5 = *(undefined8 *)(piVar4 + uVar7 + 8);
  uVar6 = (undefined4)uVar5;
  *(undefined4 *)coeffs[4] = uVar6;
  *(undefined4 *)((long)coeffs[4] + 4) = uVar6;
  *(undefined4 *)(coeffs[4] + 1) = uVar6;
  *(undefined4 *)((long)coeffs[4] + 0xc) = uVar6;
  *(undefined4 *)(coeffs[4] + 2) = uVar6;
  *(undefined4 *)((long)coeffs[4] + 0x14) = uVar6;
  *(undefined4 *)(coeffs[4] + 3) = uVar6;
  *(undefined4 *)((long)coeffs[4] + 0x1c) = uVar6;
  uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
  *(undefined4 *)coeffs[5] = uVar6;
  *(undefined4 *)((long)coeffs[5] + 4) = uVar6;
  *(undefined4 *)(coeffs[5] + 1) = uVar6;
  *(undefined4 *)((long)coeffs[5] + 0xc) = uVar6;
  *(undefined4 *)(coeffs[5] + 2) = uVar6;
  *(undefined4 *)((long)coeffs[5] + 0x14) = uVar6;
  *(undefined4 *)(coeffs[5] + 3) = uVar6;
  *(undefined4 *)((long)coeffs[5] + 0x1c) = uVar6;
  return;
}

Assistant:

static inline void prepare_coeffs_12taps(
    const InterpFilterParams *const filter_params, const int subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  __m128i coeff_8 = _mm_loadu_si128((__m128i *)filter);
  __m256i coeff = _mm256_broadcastsi128_si256(coeff_8);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi32(coeff, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi32(coeff, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi32(coeff, 0xff);
  // coeffs 8 9 10 11 0 0 0 0
  coeff_8 = _mm_loadl_epi64((__m128i *)(filter + 8));
  coeff = _mm256_broadcastq_epi64(coeff_8);
  coeffs[4] = _mm256_shuffle_epi32(coeff, 0x00);  // coeffs 8 9 8 9 8 9 8 9
  coeffs[5] = _mm256_shuffle_epi32(coeff, 0x55);  // coeffs 10 11 10 11.. 10 11
}